

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O0

void __thiscall
InstructionGenerator::genCreateString(InstructionGenerator *this,string *identifier,string *val)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  bool bVar1;
  Variable local_80;
  reference local_50;
  char *c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  Instruction local_24;
  string *local_20;
  string *val_local;
  string *identifier_local;
  InstructionGenerator *this_local;
  
  local_24 = CREATE_STRING;
  local_20 = val;
  val_local = identifier;
  identifier_local = (string *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,&local_24);
  this_00 = this->bytecode;
  __range1 = (string *)std::__cxx11::string::size();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
            (this_00,(unsigned_long *)&__range1);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&c);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<char_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode,local_50);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  Variable::Variable(&local_80,val_local,STRING);
  VirtualStack::push(&this->super_VirtualStack,&local_80);
  Variable::~Variable(&local_80);
  return;
}

Assistant:

void InstructionGenerator::genCreateString(const std::string &identifier, const std::string &val)
{
    bytecode->emplace_back(Instruction::CREATE_STRING);
    bytecode->emplace_back(val.size());
    for(const auto &c : val)
        bytecode->emplace_back(c);
    push(Variable(identifier, DataType::STRING));
}